

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
Graph<std::pair<double,_double>_>::twoOptSwap
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          Graph<std::pair<double,_double>_> *this,vector<int,_std::allocator<int>_> *ord,int *i,
          int *k)

{
  int iVar1;
  iterator iVar2;
  bool bVar3;
  ulong uVar4;
  int *piVar5;
  pointer piVar6;
  long lVar7;
  ulong uVar8;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < *i) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      piVar6 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      uVar4 = (long)(ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
      if (uVar4 <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                   ,uVar4);
      }
      piVar5 = (int *)((long)piVar6 + lVar7);
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar2,piVar5);
      }
      else {
        *iVar2._M_current = *piVar5;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 4;
    } while ((long)uVar8 < (long)*i);
  }
  iVar1 = *k;
  if (*i <= iVar1) {
    lVar7 = (long)iVar1 * 4;
    uVar8 = (long)iVar1;
    do {
      piVar6 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      uVar4 = (long)(ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
      if (uVar4 <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                   ,uVar4);
      }
      piVar5 = (int *)((long)piVar6 + lVar7);
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar2,piVar5);
      }
      else {
        *iVar2._M_current = *piVar5;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      lVar7 = lVar7 + -4;
      bVar3 = (long)*i < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar3);
  }
  uVar8 = (long)*k + 1;
  piVar6 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (uVar8 < (ulong)((long)(ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar6 >> 2)) {
    lVar7 = (long)*k * 4;
    do {
      lVar7 = lVar7 + 4;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar2,
                   (int *)((long)piVar6 + lVar7));
      }
      else {
        *iVar2._M_current = *(int *)((long)piVar6 + lVar7);
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      uVar8 = uVar8 + 1;
      piVar6 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar8 < (ulong)((long)(ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar6 >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Graph<T>::twoOptSwap(const vector<int> &ord, const int &i, const int &k) {
    vector<int> new_ord;

    for (int c = 0; c < i; c++) {
        new_ord.push_back(ord.at(c));
    }

    for (int c = k; c >= i; c--) {
        new_ord.push_back(ord.at(c));
    }

    for (int c = k + 1; c < ord.size(); c++) {
        new_ord.push_back(ord.at(c));
    }

    return new_ord;
}